

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

int reportComment(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  XML_Char *s;
  int iVar1;
  
  if (parser->m_commentHandler == (XML_CommentHandler)0x0) {
    iVar1 = 1;
    if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
      reportDefault(parser,enc,start,end);
    }
  }
  else {
    s = poolStoreString(&parser->m_tempPool,enc,start + (long)enc->minBytesPerChar * 4,
                        end + (long)enc->minBytesPerChar * -3);
    if (s == (XML_Char *)0x0) {
      iVar1 = 0;
    }
    else {
      normalizeLines(s);
      (*parser->m_commentHandler)(parser->m_handlerArg,s);
      poolClear(&parser->m_tempPool);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int
reportComment(XML_Parser parser, const ENCODING *enc, const char *start,
              const char *end) {
  XML_Char *data;
  if (! parser->m_commentHandler) {
    if (parser->m_defaultHandler)
      reportDefault(parser, enc, start, end);
    return 1;
  }
  data = poolStoreString(&parser->m_tempPool, enc,
                         start + enc->minBytesPerChar * 4,
                         end - enc->minBytesPerChar * 3);
  if (! data)
    return 0;
  normalizeLines(data);
  parser->m_commentHandler(parser->m_handlerArg, data);
  poolClear(&parser->m_tempPool);
  return 1;
}